

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void prepdelem(rnndb *db,rnndelem *elem,char *prefix,rnnvarinfo *parvi,int width)

{
  rnnvarinfo *vi;
  rnngroup **pprVar1;
  rnngroup *prVar2;
  char *__ptr;
  int iVar3;
  rnndelem **pprVar4;
  rnndelem *prVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  char **local_50;
  
  if (elem->type == RNN_ETYPE_USE_GROUP) {
    iVar7 = db->groupsnum;
    if ((long)iVar7 < 1) {
      pcVar6 = elem->name;
    }
    else {
      pprVar1 = db->groups;
      pcVar6 = elem->name;
      lVar8 = 0;
      do {
        prVar2 = pprVar1[lVar8];
        iVar3 = strcmp(prVar2->name,pcVar6);
        if (iVar3 == 0) {
          if (0 < prVar2->subelemsnum) {
            iVar7 = elem->subelemsnum;
            lVar8 = 0;
            do {
              iVar3 = elem->subelemsmax;
              if (iVar3 <= iVar7) {
                iVar7 = iVar3 * 2;
                if (iVar3 == 0) {
                  iVar7 = 0x10;
                }
                elem->subelemsmax = iVar7;
                pprVar4 = (rnndelem **)realloc(elem->subelems,(long)iVar7 << 3);
                elem->subelems = pprVar4;
              }
              prVar5 = copydelem(prVar2->subelems[lVar8],elem->file);
              iVar3 = elem->subelemsnum;
              iVar7 = iVar3 + 1;
              elem->subelemsnum = iVar7;
              elem->subelems[iVar3] = prVar5;
              lVar8 = lVar8 + 1;
            } while (lVar8 < prVar2->subelemsnum);
          }
          goto LAB_00267a0a;
        }
        lVar8 = lVar8 + 1;
      } while (iVar7 != lVar8);
    }
    fprintf(_stderr,"group %s not found!\n",pcVar6);
    db->estatus = 1;
LAB_00267a0a:
    elem->type = RNN_ETYPE_STRIPE;
    elem->length = 1;
    free(elem->name);
    elem->name = (char *)0x0;
  }
  else if (elem->name != (char *)0x0) {
    pcVar6 = catstr(prefix,elem->name);
    elem->fullname = pcVar6;
    goto LAB_00267a43;
  }
  pcVar6 = elem->fullname;
LAB_00267a43:
  local_50 = &elem->name;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = prefix;
  }
  vi = &elem->varinfo;
  prepvarinfo(db,pcVar6,vi,parvi);
  if ((elem->varinfo).dead == 0) {
    if ((elem->length != 1) && (elem->stride == 0)) {
      if (elem->type == RNN_ETYPE_REG) {
        elem->stride = (long)(elem->width / width);
      }
      else {
        fprintf(_stderr,"%s has non-1 length, but no stride!\n",elem->fullname);
        db->estatus = 1;
      }
    }
    pcVar6 = prefix;
    if (elem->name != (char *)0x0) {
      pcVar6 = elem->fullname;
    }
    preptypeinfo(db,&elem->typeinfo,pcVar6,vi,elem->width,elem->file);
    if (0 < elem->subelemsnum) {
      lVar8 = 0;
      do {
        pcVar6 = prefix;
        if (elem->name != (char *)0x0) {
          pcVar6 = elem->fullname;
        }
        prepdelem(db,elem->subelems[lVar8],pcVar6,vi,width);
        lVar8 = lVar8 + 1;
      } while (lVar8 < elem->subelemsnum);
    }
    pcVar6 = (elem->varinfo).prefix;
    if ((pcVar6 != (char *)0x0) && (*local_50 != (char *)0x0)) {
      __ptr = elem->fullname;
      pcVar6 = aprintf("%s_%s",pcVar6,__ptr);
      elem->fullname = pcVar6;
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

static void prepdelem(struct rnndb *db, struct rnndelem *elem, char *prefix, struct rnnvarinfo *parvi, int width) {
	if (elem->type == RNN_ETYPE_USE_GROUP) {
		int i;
		struct rnngroup *gr = 0;
		for (i = 0; i < db->groupsnum; i++)
			if (!strcmp(db->groups[i]->name, elem->name)) {
				gr = db->groups[i];
				break;
			}
		if (gr) {
			for (i = 0; i < gr->subelemsnum; i++)
				ADDARRAY(elem->subelems, copydelem(gr->subelems[i], elem->file));
		} else {
			fprintf (stderr, "group %s not found!\n", elem->name);
			db->estatus = 1;
		}
		elem->type = RNN_ETYPE_STRIPE;
		elem->length = 1;
		free(elem->name);
		elem->name = 0;
	}
	if (elem->name)
		elem->fullname = catstr(prefix, elem->name);
	prepvarinfo (db, elem->fullname?elem->fullname:prefix, &elem->varinfo, parvi);
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1 && !elem->stride) {
		if (elem->type != RNN_ETYPE_REG) {
			fprintf (stderr, "%s has non-1 length, but no stride!\n", elem->fullname);
			db->estatus = 1;
		} else {
			elem->stride = elem->width/width;
		}
	}
	preptypeinfo(db, &elem->typeinfo, elem->name?elem->fullname:prefix, &elem->varinfo, elem->width, elem->file);

	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		prepdelem(db,  elem->subelems[i], elem->name?elem->fullname:prefix, &elem->varinfo, width);
	if (elem->varinfo.prefix && elem->name) {
		char *tmp = elem->fullname;
		elem->fullname = catstr(elem->varinfo.prefix, elem->fullname);
		free(tmp);
	}
}